

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalAnyJoin::Serialize(LogicalAnyJoin *this,Serializer *serializer)

{
  LogicalOperator::Serialize((LogicalOperator *)this,serializer);
  Serializer::WriteProperty<duckdb::JoinType>
            (serializer,200,"join_type",&(this->super_LogicalJoin).super_LogicalOperator.field_0x61)
  ;
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"mark_index",&(this->super_LogicalJoin).mark_index);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xca,"left_projection_map",&(this->super_LogicalJoin).left_projection_map);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xcb,"right_projection_map",&(this->super_LogicalJoin).right_projection_map)
  ;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xcc,"condition",&this->condition);
  return;
}

Assistant:

void LogicalAnyJoin::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty<JoinType>(200, "join_type", join_type);
	serializer.WritePropertyWithDefault<idx_t>(201, "mark_index", mark_index);
	serializer.WritePropertyWithDefault<vector<idx_t>>(202, "left_projection_map", left_projection_map);
	serializer.WritePropertyWithDefault<vector<idx_t>>(203, "right_projection_map", right_projection_map);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(204, "condition", condition);
}